

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

uint64_t float128_to_uint64_riscv32(float128 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar3 = a.high;
  uVar5 = a.low;
  uVar2 = uVar3 & 0xffffffffffff;
  uVar6 = a.high._6_2_ & 0x7fff;
  if (0x3ffe < uVar6 && (long)uVar3 < 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -(ulong)((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) !=
                     (undefined1  [16])0x0 || uVar5 != 0) && (~uVar3 & 0x7fff000000000000) == 0);
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
LAB_00bfcfc1:
    uVar2 = (ulong)(uVar2 != 0 || uVar5 != 0);
LAB_00bfcfcb:
    uVar1 = 0;
  }
  else {
    uVar1 = uVar2 + 0x1000000000000;
    if (uVar6 < 0x402f) {
      if (uVar6 < 0x3ff0) {
        uVar2 = 1;
        if (uVar6 != 0x3fef) goto LAB_00bfcfc1;
        uVar2 = uVar1 | uVar5 != 0;
        goto LAB_00bfcfcb;
      }
      uVar2 = (ulong)(uVar5 != 0) | uVar1 << (a.high._6_1_ + 0x11U & 0x3f);
      uVar1 = uVar1 >> (0x2fU - (char)uVar6 & 0x3f);
    }
    else {
      if (0x403e < uVar6) {
        status->float_exception_flags = status->float_exception_flags | 1;
        return 0xffffffffffffffff;
      }
      bVar4 = (byte)(uVar6 - 0x402f);
      uVar2 = uVar5 << (bVar4 & 0x3f);
      if (uVar6 - 0x402f != 0) {
        uVar1 = uVar1 << (bVar4 & 0x3f) | uVar5 >> (0x2fU - a.high._6_1_ & 0x3f);
      }
    }
  }
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    bVar4 = (byte)(uVar2 >> 0x3f);
    goto LAB_00bfd017;
  case '\x01':
    bVar7 = (long)uVar3 < 0;
    break;
  case '\x02':
    bVar7 = -1 < (long)uVar3;
    break;
  case '\x03':
    goto switchD_00bfcfe9_caseD_3;
  case '\x05':
    bVar7 = (uVar1 & 1) == 0;
    break;
  default:
    abort();
  }
  bVar4 = uVar2 != 0 & bVar7;
LAB_00bfd017:
  if (bVar4 == 0) {
switchD_00bfcfe9_caseD_3:
    if ((-1 < (long)uVar3) || (uVar1 == 0)) {
      bVar4 = 0x20;
      if (uVar2 == 0) {
        return uVar1;
      }
      goto LAB_00bfd062;
    }
    uVar1 = 0;
  }
  else {
    if (uVar1 + 1 != 0) {
      uVar1 = uVar1 + 1 &
              ~(ulong)((uVar2 & 0x7fffffffffffffff) == 0 && status->float_rounding_mode == '\0');
      goto switchD_00bfcfe9_caseD_3;
    }
    uVar1 = 0xffffffffffffffff;
  }
  bVar4 = 1;
LAB_00bfd062:
  status->float_exception_flags = status->float_exception_flags | bVar4;
  return uVar1;
}

Assistant:

uint64_t float128_to_uint64(float128 a, float_status *status)
{
    flag aSign;
    int aExp;
    int shiftCount;
    uint64_t aSig0, aSig1;

    aSig0 = extractFloat128Frac0(a);
    aSig1 = extractFloat128Frac1(a);
    aExp = extractFloat128Exp(a);
    aSign = extractFloat128Sign(a);
    if (aSign && (aExp > 0x3FFE)) {
        float_raise(float_flag_invalid, status);
        if (float128_is_any_nan(a)) {
            return UINT64_MAX;
        } else {
            return 0;
        }
    }
    if (aExp) {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shiftCount = 0x402F - aExp;
    if (shiftCount <= 0) {
        if (0x403E < aExp) {
            float_raise(float_flag_invalid, status);
            return UINT64_MAX;
        }
        shortShift128Left(aSig0, aSig1, -shiftCount, &aSig0, &aSig1);
    } else {
        shift64ExtraRightJamming(aSig0, aSig1, shiftCount, &aSig0, &aSig1);
    }
    return roundAndPackUint64(aSign, aSig0, aSig1, status);
}